

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

int Acb_ObjSuppMin_int(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  word wVar2;
  int *piVar3;
  Vec_Int_t *p_00;
  int iVar4;
  long lVar5;
  
  wVar2 = Acb_ObjTruth(p,iObj);
  piVar3 = Acb_ObjFanins(p,iObj);
  iVar4 = *piVar3;
  if (*piVar3 < 1) {
    iVar4 = 0;
  }
  lVar5 = 0;
  do {
    if (iVar4 == (int)lVar5) {
      return 0;
    }
    iVar1 = Abc_Tt6HasVar(wVar2,(int)lVar5);
    lVar5 = lVar5 + 1;
  } while (iVar1 != 0);
  iVar4 = piVar3[lVar5];
  iVar1 = (int)lVar5 + -1;
  Acb_ObjDeleteFaninIndex(p,iObj,iVar1);
  p_00 = Vec_WecEntry(&p->vFanouts,iVar4);
  Vec_IntRemove(p_00,iObj);
  wVar2 = Abc_Tt6RemoveVar(wVar2,iVar1);
  Vec_WrdWriteEntry(&p->vObjTruth,iObj,wVar2);
  return 1;
}

Assistant:

int Acb_ObjSuppMin_int( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins;
    word uTruth = Acb_ObjTruth( p, iObj );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Abc_Tt6HasVar(uTruth, k) )
            continue;
        Acb_ObjDeleteFaninIndex( p, iObj, k );
        Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
        Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruth, k) );
        return 1;
    }
    return 0;
}